

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_implementation.hpp
# Opt level: O1

event_queue_t * __thiscall
so_5::disp::thread_pool::common_implementation::
dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
::bind_agent(dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
             *this,agent_ref_t *agent,bind_params_t *params)

{
  atomic_refcounted_t *paVar1;
  agent_t *paVar2;
  int iVar3;
  event_queue_t *peVar4;
  agent_ref_t local_30;
  agent_ref_t local_28;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_lock);
  if (iVar3 == 0) {
    paVar2 = agent->m_obj;
    if (params->m_fifo == individual) {
      agent->m_obj = (agent_t *)0x0;
      local_28.m_obj = paVar2;
      peVar4 = bind_agent_with_inidividual_fifo(this,&local_28,params);
      if (local_28.m_obj != (agent_t *)0x0) {
        LOCK();
        paVar1 = &(local_28.m_obj)->super_atomic_refcounted_t;
        (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
             (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
        UNLOCK();
        if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
           (local_28.m_obj != (agent_t *)0x0)) {
          (*(local_28.m_obj)->_vptr_agent_t[1])();
        }
        local_28.m_obj = (agent_t *)0x0;
      }
    }
    else {
      agent->m_obj = (agent_t *)0x0;
      local_30.m_obj = paVar2;
      peVar4 = bind_agent_with_cooperation_fifo(this,&local_30,params);
      if (local_30.m_obj != (agent_t *)0x0) {
        LOCK();
        paVar1 = &(local_30.m_obj)->super_atomic_refcounted_t;
        (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
             (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
        UNLOCK();
        if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
           (local_30.m_obj != (agent_t *)0x0)) {
          (*(local_30.m_obj)->_vptr_agent_t[1])();
        }
        local_30.m_obj = (agent_t *)0x0;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
    return peVar4;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

virtual event_queue_t *
		bind_agent( agent_ref_t agent, const PARAMS & params ) override
			{
				std::lock_guard< std::mutex > lock( m_lock );

				if( ADAPTATIONS::is_individual_fifo( params ) )
					return bind_agent_with_inidividual_fifo(
							std::move( agent ), params );

				return bind_agent_with_cooperation_fifo(
						std::move( agent ), params );
			}